

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::substring::
     merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pos_type pVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  int extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  int extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  int extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  int extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  int extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  int extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  int extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  BitmapArray<long> *pBVar5;
  pos_type pVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  iterator p1;
  iterator p2;
  ulong local_80;
  
  uVar9 = buf.pos_;
  pBVar5 = buf.array_;
  pVar6 = PA.pos_;
  p1.array_ = PA.array_;
  helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
            (middle,last,buf);
  uVar12 = ~middle.pos_ + uVar9 + last.pos_;
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
  iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
  uVar11 = middle.pos_ - 1;
  (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
  bVar14 = extraout_var_01 < 0;
  if (bVar14) {
    iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
    uVar10 = ~CONCAT44(extraout_var_03,iVar2);
  }
  else {
    iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
    uVar10 = CONCAT44(extraout_var_02,iVar2);
  }
  uVar3 = extraout_var >> 0x1f;
  uVar13 = CONCAT44(extraout_var_00,iVar1) ^ (long)(int)extraout_var >> 0x1f;
  pVar4 = uVar10 + pVar6;
  lVar7 = last.pos_ - 1;
  iVar1 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
LAB_00109cf5:
  do {
    p1.pos_ = uVar13 + pVar6;
    lVar8 = lVar7;
    while( true ) {
      p2.pos_ = pVar4;
      p2.array_ = p1.array_;
      iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      if (0 < iVar2) goto LAB_00109e35;
      if (-1 < iVar2) break;
      lVar7 = lVar8;
      uVar10 = uVar11;
      if (bVar14) {
        do {
          lVar7 = lVar8 + -1;
          iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar10);
          (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last.array_,lVar8,CONCAT44(extraout_var_05,iVar2));
          uVar11 = uVar10 - 1;
          iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,uVar10,CONCAT44(extraout_var_06,iVar2));
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
          lVar8 = lVar7;
          uVar10 = uVar11;
        } while (extraout_var_07 < 0);
        bVar14 = false;
      }
      lVar8 = lVar7 + -1;
      iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,lVar7,CONCAT44(extraout_var_08,iVar2));
      iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar8);
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                (middle.array_,uVar11,CONCAT44(extraout_var_09,iVar2));
      lVar7 = lVar8;
      uVar10 = uVar12;
      if (uVar11 <= first.pos_) goto joined_r0x0010a1c8;
      uVar11 = uVar11 - 1;
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
      if (extraout_var_10 < 0) {
        bVar14 = true;
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
        uVar10 = ~CONCAT44(extraout_var_12,iVar2);
      }
      else {
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
        uVar10 = CONCAT44(extraout_var_11,iVar2);
      }
      pVar4 = uVar10 + pVar6;
    }
    lVar7 = lVar8;
    local_80 = uVar12;
    if (uVar3 != 0) {
      do {
        lVar7 = lVar8 + -1;
        iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,lVar8,CONCAT44(extraout_var_13,iVar2));
        local_80 = uVar12 - 1;
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar12,CONCAT44(extraout_var_14,iVar2));
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
        lVar8 = lVar7;
        uVar12 = local_80;
      } while (extraout_var_15 < 0);
      uVar3 = 0;
    }
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
    lVar8 = lVar7 + -1;
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,lVar7,~CONCAT44(extraout_var_16,iVar2));
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar8);
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_17,iVar2));
    if (local_80 <= uVar9) goto LAB_0010a2a1;
    uVar12 = uVar11;
    lVar7 = lVar8;
    if (bVar14) {
      do {
        lVar8 = lVar7 + -1;
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar12);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,lVar7,CONCAT44(extraout_var_18,iVar2));
        uVar11 = uVar12 - 1;
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar8);
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (middle.array_,uVar12,CONCAT44(extraout_var_19,iVar2));
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
        uVar12 = uVar11;
        lVar7 = lVar8;
      } while (extraout_var_20 < 0);
      bVar14 = false;
    }
    uVar12 = local_80 - 1;
    lVar7 = lVar8 + -1;
    iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,lVar8,CONCAT44(extraout_var_21,iVar2));
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
    (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
              (middle.array_,uVar11,CONCAT44(extraout_var_22,iVar2));
    uVar10 = uVar12;
    if (uVar11 <= first.pos_) {
      for (; uVar9 < uVar12; uVar12 = uVar12 - 1) {
        iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,lVar7,CONCAT44(extraout_var_39,iVar2));
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7 + -1);
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar12,CONCAT44(extraout_var_40,iVar2));
        uVar10 = uVar9;
        lVar7 = lVar7 + -1;
      }
      goto LAB_0010a282;
    }
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
    if (extraout_var_23 < 0) {
      uVar3 = 1;
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
      uVar13 = ~CONCAT44(extraout_var_33,iVar2);
    }
    else {
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
      uVar13 = CONCAT44(extraout_var_24,iVar2);
    }
    uVar11 = uVar11 - 1;
    (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
    if (extraout_var_34 < 0) {
      bVar14 = true;
      iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
      pVar4 = ~CONCAT44(extraout_var_36,iVar2) + pVar6;
    }
    else {
      iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar11);
      pVar4 = CONCAT44(extraout_var_35,iVar2) + pVar6;
    }
  } while( true );
LAB_00109e35:
  if (uVar3 != 0) {
    do {
      lVar7 = lVar8 + -1;
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,lVar8,CONCAT44(extraout_var_25,iVar2));
      uVar10 = uVar12 - 1;
      iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar12,CONCAT44(extraout_var_26,iVar2));
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar10);
      lVar8 = lVar7;
      uVar12 = uVar10;
    } while (extraout_var_27 < 0);
    uVar3 = 0;
  }
  lVar7 = lVar8 + -1;
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
  (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
            (last.array_,lVar8,CONCAT44(extraout_var_28,iVar2));
  iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar12,CONCAT44(extraout_var_29,iVar2));
  if (uVar12 <= uVar9) goto LAB_0010a2a1;
  uVar12 = uVar12 - 1;
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
  if (extraout_var_30 < 0) {
    uVar3 = 1;
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
    uVar13 = ~CONCAT44(extraout_var_32,iVar2);
  }
  else {
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
    uVar13 = CONCAT44(extraout_var_31,iVar2);
  }
  goto LAB_00109cf5;
joined_r0x0010a1c8:
  for (; uVar9 < uVar12; uVar12 = uVar12 - 1) {
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar12);
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,lVar7,CONCAT44(extraout_var_37,iVar2));
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7 + -1);
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar12,CONCAT44(extraout_var_38,iVar2));
    lVar7 = lVar7 + -1;
    uVar10 = uVar9;
  }
LAB_0010a282:
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar10);
  (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
            (last.array_,lVar7,CONCAT44(extraout_var_41,iVar2));
LAB_0010a2a1:
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar9,CONCAT44(extraout_var_04,iVar1));
  return;
}

Assistant:

void merge_backward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type p1, p2;
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r, x;

  bufend = buf + (last - middle);
  helper::vecswap(middle, last, buf);

  x = 0;
  if (*(bufend - 1) < 0) {
    x |= 1;
    p1 = PA + ~*(bufend - 1);
  } else {
    p1 = PA + *(bufend - 1);
  }
  if (*(middle - 1) < 0) {
    x |= 2;
    p2 = PA + ~*(middle - 1);
  } else {
    p2 = PA + *(middle - 1);
  }
  for (t = *(last - 1), i = last - 1, j = bufend - 1, k = middle - 1;;) {

    r = compare(T, p1, p2, depth);
    if (r > 0) {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = *j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }

      if (*--j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
    } else if (r < 0) {
      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }

      if (*--k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    } else {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = ~*j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }
      --j;

      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }
      --k;

      if (*j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
      if (*k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    }
  }
}